

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyhanabi.cc
# Opt level: O0

int StateLenMoveHistory(pyhanabi_state_t *state)

{
  vector<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>
  *this;
  size_type sVar1;
  long *in_RDI;
  
  if (in_RDI == (long *)0x0) {
    __assert_fail("state != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                  ,0x1e2,"int StateLenMoveHistory(pyhanabi_state_t *)");
  }
  if (*in_RDI != 0) {
    this = hanabi_learning_env::HanabiState::MoveHistory((HanabiState *)*in_RDI);
    sVar1 = std::
            vector<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>
            ::size(this);
    return (int)sVar1;
  }
  __assert_fail("state->state != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                ,0x1e3,"int StateLenMoveHistory(pyhanabi_state_t *)");
}

Assistant:

int StateLenMoveHistory(pyhanabi_state_t* state) {
  REQUIRE(state != nullptr);
  REQUIRE(state->state != nullptr);
  return reinterpret_cast<const hanabi_learning_env::HanabiState*>(state->state)
      ->MoveHistory()
      .size();
}